

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-workload-benchmark.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  void *pvVar2;
  char *__s;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  size_t sVar8;
  uint uVar9;
  thread *t;
  ulong uVar10;
  pointer ptVar11;
  int iVar12;
  code *__f;
  thread *t_00;
  long lVar13;
  long lVar14;
  WorkloadFunc func;
  string workload_name;
  vector<float,_std::allocator<float>_> results;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  inputs;
  int local_f0;
  _Any_data local_e8;
  code *local_d8;
  undefined8 uStack_d0;
  char **local_c8;
  thread local_c0;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  vector<float,_std::allocator<float>_> local_98;
  pointer local_80;
  reference_wrapper<float> local_78;
  reference_wrapper<const_std::vector<float,_std::allocator<float>_>_> local_70;
  vector<std::thread,_std::allocator<std::thread>_> local_68;
  locale local_50 [8];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_48;
  
  local_c8 = argv;
  std::locale::locale((locale *)local_e8._M_pod_data,"");
  std::ios::imbue(local_50);
  std::locale::~locale(local_50);
  std::locale::~locale((locale *)local_e8._M_pod_data);
  uVar9 = argc / 2;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_98,(long)(int)uVar9,(allocator_type *)local_e8._M_pod_data);
  local_80 = local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&local_68,(long)(int)uVar9,(allocator_type *)local_e8._M_pod_data);
  lVar6 = std::chrono::_V2::system_clock::now();
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&local_48,(long)(int)(uVar9 + 1),(allocator_type *)local_e8._M_pod_data);
  if (1 < argc) {
    uVar10 = (ulong)uVar9;
    lVar13 = 0x10;
    do {
      make_input_array((vector<float,_std::allocator<float>_> *)&local_e8,100000000);
      pvVar2 = *(void **)((long)local_48.
                                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x10);
      lVar14 = *(long *)((long)&((local_48.
                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar13);
      puVar1 = (undefined8 *)
               ((long)local_48.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x10);
      *puVar1 = local_e8._M_unused._M_object;
      puVar1[1] = local_e8._8_8_;
      *(code **)((long)&((local_48.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar13) = local_d8;
      local_e8._M_unused._M_object = (void *)0x0;
      local_e8._8_8_ = 0;
      local_d8 = (code *)0x0;
      if ((pvVar2 != (void *)0x0) &&
         (operator_delete(pvVar2,lVar14 - (long)pvVar2), local_e8._M_unused._M_object != (void *)0x0
         )) {
        operator_delete(local_e8._M_unused._M_object,(long)local_d8 - local_e8._0_8_);
      }
      lVar13 = lVar13 + 0x18;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Created ",8);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar9 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," input arrays",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; elapsed: ",0xb);
  lVar13 = std::chrono::_V2::system_clock::now();
  poVar7 = std::ostream::_M_insert<double>((double)(lVar13 - lVar6) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ms\n",4);
  if (1 < argc) {
    lVar6 = 0;
    lVar13 = 0;
    lVar14 = 0;
    local_f0 = 0;
    iVar12 = 2;
    do {
      local_d8 = (code *)0x0;
      uStack_d0 = 0;
      local_e8._M_unused._M_object = (void *)0x0;
      local_e8._8_8_ = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,*(char **)((long)local_c8 + lVar14 * 2 + 8),
                 (allocator<char> *)&local_c0);
      iVar4 = std::__cxx11::string::compare((char *)&local_b8);
      __f = workload_fpchurn;
      if (iVar4 == 0) {
LAB_00103509:
        std::function<void(std::vector<float,std::allocator<float>>const&,float&)>::operator=
                  ((function<void(std::vector<float,std::allocator<float>>const&,float&)> *)
                   local_e8._M_pod_data,__f);
        iVar4 = 0;
        if (iVar12 < argc) {
          iVar4 = atoi(*(char **)((long)local_c8 + lVar14 * 2 + 0x10));
        }
        iVar5 = pthread_mutex_lock((pthread_mutex_t *)&iomutex);
        if (iVar5 != 0) {
          std::__throw_system_error(iVar5);
LAB_0010373a:
          std::terminate();
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Spawning workload \'",0x13);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_b8,local_b0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' on CPU ",9);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        pthread_mutex_unlock((pthread_mutex_t *)&iomutex);
        local_70._M_data =
             (vector<float,_std::allocator<float>_> *)
             ((long)&((local_48.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar13);
        local_78._M_data =
             (float *)((long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar6);
        std::thread::
        thread<std::function<void(std::vector<float,std::allocator<float>>const&,float&)>&,std::reference_wrapper<std::vector<float,std::allocator<float>>const>,std::reference_wrapper<float>,void>
                  (&local_c0,
                   (function<void_(const_std::vector<float,_std::allocator<float>_>_&,_float_&)> *)
                   &local_e8,&local_70,&local_78);
        if (*(long *)((long)&((local_68.
                               super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                               .super__Vector_impl_data._M_start)->_M_id)._M_thread + lVar14) != 0)
        goto LAB_0010373a;
        t_00 = (thread *)
               ((long)&((local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread + lVar14);
        (t_00->_M_id)._M_thread = (native_handle_type)local_c0._M_id._M_thread;
        bVar3 = true;
        pin_thread_to_cpu(t_00,iVar4);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_b8);
        __f = workload_sin;
        if (iVar4 == 0) goto LAB_00103509;
        iVar4 = std::__cxx11::string::compare((char *)&local_b8);
        __f = workload_accum;
        if (iVar4 == 0) goto LAB_00103509;
        iVar4 = std::__cxx11::string::compare((char *)&local_b8);
        __f = workload_unrollaccum4;
        if (iVar4 == 0) goto LAB_00103509;
        iVar4 = std::__cxx11::string::compare((char *)&local_b8);
        __f = workload_unrollaccum8;
        if (iVar4 == 0) goto LAB_00103509;
        iVar4 = std::__cxx11::string::compare((char *)&local_b8);
        __f = workload_stdaccum;
        if (iVar4 == 0) goto LAB_00103509;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unknown workload: ",0x12);
        __s = *(char **)((long)local_c8 + lVar14 * 2 + 8);
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1081b8);
        }
        else {
          sVar8 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        local_f0 = 1;
        bVar3 = false;
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
      if (local_d8 != (code *)0x0) {
        (*local_d8)(&local_e8,&local_e8,3);
      }
      if (!bVar3) goto LAB_001036ee;
      lVar14 = lVar14 + 8;
      lVar13 = lVar13 + 0x18;
      lVar6 = lVar6 + 4;
      iVar4 = iVar12 + 1;
      iVar12 = iVar12 + 2;
    } while (iVar4 < argc);
  }
  local_f0 = 0;
  for (ptVar11 = local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ptVar11 !=
      local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish; ptVar11 = ptVar11 + 1) {
    std::thread::join();
  }
LAB_001036ee:
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_48);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_68);
  if (local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_f0;
}

Assistant:

int main(int argc, const char** argv) {
  // Set locale for comma-separation in large numbers.
  std::cout.imbue(std::locale(""));

  // Command-line invocation:
  //
  //  argv[0] is the program name
  //  argv[1] is workload name, with cpu number at argv[2]
  //  argv[3] is workload name, with cpu number at argv[4]
  //  ... etc.

  int num_workloads = argc / 2;
  std::vector<float> results(num_workloads);
  do_not_optimize(results.data());
  std::vector<std::thread> threads(num_workloads);

  constexpr size_t INPUT_SIZE = 100 * 1000 * 1000;
  auto t1 = hires_clock::now();

  // Allocate and initialize one extra input array - not used by any workload.
  // This makes sure none of the actual working inputs stays in L3 cache (which
  // is fairly sizable), giving one of the workloads an unfair advantage. The
  // lower cache layers are so small compared to the input size that their
  // pre-seeding advantage is negligible.
  std::vector<std::vector<float>> inputs(num_workloads + 1);
  for (int i = 0; i < num_workloads; ++i) {
    inputs[i] = make_input_array(INPUT_SIZE);
  }
  std::cout << "Created " << num_workloads + 1 << " input arrays"
            << "; elapsed: " << duration_ms(hires_clock::now() - t1).count()
            << " ms\n";

  for (int i = 1; i < argc; i += 2) {
    WorkloadFunc func;
    std::string workload_name = argv[i];
    if (workload_name == "fpchurn") {
      func = workload_fpchurn;
    } else if (workload_name == "sin") {
      func = workload_sin;
    } else if (workload_name == "accum") {
      func = workload_accum;
    } else if (workload_name == "unrollaccum4") {
      func = workload_unrollaccum4;
    } else if (workload_name == "unrollaccum8") {
      func = workload_unrollaccum8;
    } else if (workload_name == "stdaccum") {
      func = workload_stdaccum;
    } else {
      std::cerr << "unknown workload: " << argv[i] << "\n";
      return 1;
    }

    int cpu_num;
    if (i + 1 >= argc) {
      cpu_num = 0;
    } else {
      cpu_num = std::atoi(argv[i + 1]);
    }

    {
      std::lock_guard<std::mutex> iolock(iomutex);
      std::cout << "Spawning workload '" << workload_name << "' on CPU "
                << cpu_num << "\n";
    }

    int nworkload = i / 2;
    threads[nworkload] = std::thread(func, std::cref(inputs[nworkload]),
                                     std::ref(results[nworkload]));
    pin_thread_to_cpu(threads[nworkload], cpu_num);
  }

  // All the threads were launched in parallel in the loop above. Now wait for
  // all of them to finish.
  for (auto& t : threads) {
    t.join();
  }
  return 0;
}